

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexReader::PtexReader
          (PtexReader *this,bool premultiply,PtexInputHandler *io,PtexErrorHandler *err)

{
  _func_int **in_RCX;
  PtexTexture *in_RDX;
  byte in_SIL;
  PtexTexture *in_RDI;
  DefaultInputHandler *in_stack_ffffffffffffff70;
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *this_00;
  PtexTexture *local_58;
  
  PtexTexture::PtexTexture(in_RDI);
  in_RDI->_vptr_PtexTexture = (_func_int **)&PTR__PtexReader_00173428;
  Mutex::Mutex((Mutex *)0x135447);
  DefaultInputHandler::DefaultInputHandler(in_stack_ffffffffffffff70);
  local_58 = in_RDX;
  if (in_RDX == (PtexTexture *)0x0) {
    local_58 = in_RDI + 6;
  }
  in_RDI[8]._vptr_PtexTexture = (_func_int **)local_58;
  in_RDI[9]._vptr_PtexTexture = in_RCX;
  *(byte *)&in_RDI[10]._vptr_PtexTexture = in_SIL & 1;
  *(undefined1 *)((long)&in_RDI[10]._vptr_PtexTexture + 1) = 1;
  *(undefined1 *)((long)&in_RDI[10]._vptr_PtexTexture + 2) = 1;
  *(undefined1 *)((long)&in_RDI[10]._vptr_PtexTexture + 3) = 0;
  in_RDI[0xb]._vptr_PtexTexture = (_func_int **)0x0;
  in_RDI[0xc]._vptr_PtexTexture = (_func_int **)0x0;
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  *(undefined4 *)&in_RDI[0x26]._vptr_PtexTexture = 0;
  in_RDI[0x27]._vptr_PtexTexture = (_func_int **)0x0;
  in_RDI[0x28]._vptr_PtexTexture = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[0x29]._vptr_PtexTexture = 0;
  std::vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>::vector
            ((vector<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_> *)0x135521);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x135537);
  this_00 = (PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*> *
            )(in_RDI + 0x30);
  std::vector<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_>::vector
            ((vector<Ptex::v2_2::LevelInfo,_std::allocator<Ptex::v2_2::LevelInfo>_> *)0x13554d);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)0x135563);
  std::vector<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>::
  vector((vector<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
          *)0x135579);
  std::vector<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>::
  vector((vector<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
          *)0x13558f);
  std::vector<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>::
  vector((vector<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
          *)0x1355a5);
  PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::PtexHashMap
            (this_00);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1355c9);
  in_RDI[0x55]._vptr_PtexTexture = (_func_int **)0x2c8;
  in_RDI[0x56]._vptr_PtexTexture = in_RDI[0x55]._vptr_PtexTexture;
  in_RDI[0x57]._vptr_PtexTexture = (_func_int **)0x0;
  in_RDI[0x58]._vptr_PtexTexture = (_func_int **)0x0;
  memset(in_RDI + 0x47,0,0x70);
  return;
}

Assistant:

PtexReader::PtexReader(bool premultiply, PtexInputHandler* io, PtexErrorHandler* err)
    : _io(io ? io : &_defaultIo),
      _err(err),
      _premultiply(premultiply),
      _ok(true),
      _needToOpen(true),
      _pendingPurge(false),
      _fp(0),
      _pos(0),
      _pixelsize(0),
      _constdata(0),
      _metadata(0),
      _hasEdits(false),
      _baseMemUsed(sizeof(*this)),
      _memUsed(_baseMemUsed),
      _opens(0),
      _blockReads(0)
{
    memset(&_zstream, 0, sizeof(_zstream));
}